

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

optional<long> slang::parseInt<long>(string_view name,string_view value,string *error)

{
  _Storage<long,_true> extraout_RAX;
  char *__first;
  size_t sVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  __integer_from_chars_result_type<long> _Var4;
  optional<long> oVar5;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  long val;
  _Storage<long,_true> local_80;
  string local_78;
  string local_58;
  
  __first = value._M_str;
  sVar1 = value._M_len;
  if (sVar1 == 0) {
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_78;
    local_78._M_dataplus._M_p = name._M_str;
    local_78._M_string_length = name._M_len;
    ::fmt::v9::vformat_abi_cxx11_(&local_58,(v9 *)"expected value for argument \'{}\'",fmt,args);
    std::__cxx11::string::operator=((string *)error,(string *)&local_58);
    local_80._M_value = (long)&local_58.field_2;
    local_78.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    _Var3._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_dataplus._M_p != (pointer)local_80._M_value) {
LAB_001b8315:
      operator_delete(_Var3._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1));
      local_80 = extraout_RAX;
    }
  }
  else {
    _Var4 = std::from_chars<long>(__first,__first + sVar1,&local_80._M_value,10);
    if (_Var4.ec == 0 && _Var4.ptr == __first + sVar1) {
      uVar2 = CONCAT71(_Var4._9_7_,1);
      goto LAB_001b831f;
    }
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x2c;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    local_58._M_dataplus._M_p = __first;
    local_58._M_string_length = sVar1;
    local_58.field_2._M_allocated_capacity = (size_type)name._M_str;
    local_58.field_2._8_8_ = name._M_len;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_78,(v9 *)"invalid value \'{}\' for integer argument \'{}\'",fmt_00,args_00);
    std::__cxx11::string::operator=((string *)error,(string *)&local_78);
    local_80._M_value = (long)&local_78.field_2;
    _Var3._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_dataplus._M_p != (pointer)local_80._M_value) goto LAB_001b8315;
  }
  uVar2 = 0;
LAB_001b831f:
  oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar2;
  oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = local_80._M_value;
  return (optional<long>)
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

static std::optional<T> parseInt(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}